

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

double * genLags(double *y,int N,int mlags,int *rows,int *cols)

{
  double *out;
  int i;
  int *cols_local;
  int *rows_local;
  int mlags_local;
  int N_local;
  double *y_local;
  
  if (mlags < 1) {
    y_local = (double *)calloc((long)N,8);
    *rows = 1;
    *cols = N;
  }
  else if (mlags == 1) {
    y_local = (double *)malloc((long)N << 3);
    memcpy(y_local,y,(long)N << 3);
    *rows = 1;
    *cols = N;
  }
  else {
    y_local = (double *)malloc((long)((N - mlags) + 1) * 8 * (long)mlags);
    for (out._4_4_ = 0; out._4_4_ < mlags; out._4_4_ = out._4_4_ + 1) {
      memcpy(y_local + ((N - mlags) + 1) * out._4_4_,y + (long)mlags + (-1 - (long)out._4_4_),
             (long)((N - mlags) + 1) << 3);
    }
    *rows = mlags;
    *cols = (N - mlags) + 1;
  }
  return y_local;
}

Assistant:

double* genLags(double *y, int N, int mlags, int *rows, int *cols) {
    int i;
    double *out;

    if (mlags <= 0) {
        out = (double*)calloc(N,sizeof(double));
        *rows = 1;
        *cols = N;
        return out;
    }

    if (mlags == 1) {
        out = (double*) malloc(sizeof(double)*N);
        memcpy(out,y,sizeof(double)*N);
        *rows = 1;
        *cols = N;
        return out;
    }

    out = (double*) malloc(sizeof(double) * (N-mlags+1)*mlags);

    for(i = 0; i < mlags;++i) {
        memcpy(out+(N-mlags+1)*i,y+mlags-1-i,sizeof(double)*(N-mlags+1));
    }

    *rows = mlags;
    *cols = N - mlags + 1;

    return out;

}